

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_jit_compile.c
# Opt level: O1

void compile_ref_matchingpath
               (compiler_common *common,PCRE2_SPTR16 cc,jump_list **backtracks,BOOL withchecks,
               BOOL emptyfail)

{
  PCRE2_UCHAR16 PVar1;
  ushort uVar2;
  int iVar3;
  sljit_compiler *compiler;
  sljit_u8 *psVar4;
  sljit_jump *psVar5;
  jump_list *pjVar6;
  sljit_jump *psVar7;
  sljit_jump *psVar8;
  sljit_label *psVar9;
  uint uVar10;
  jump_list **ppjVar11;
  sljit_s32 src1;
  sljit_sw src1w;
  sljit_jump *local_58;
  
  compiler = common->compiler;
  PVar1 = *cc;
  if ((ushort)(PVar1 - 0x71) < 2) {
    uVar2 = cc[1];
    if (compiler->error == 0) {
      iVar3 = common->ovector_start;
      compiler->mode32 = 0;
      psVar4 = emit_x86_instruction(compiler,1,1,0,0x8e,(ulong)uVar2 * 0x10 + (long)iVar3);
      if (psVar4 != (sljit_u8 *)0x0) {
        *psVar4 = 0x8b;
      }
    }
    uVar10 = (uint)uVar2 * 2;
    if ((withchecks != 0) && (common->unset_backref == 0)) {
      pjVar6 = (jump_list *)0x0;
      psVar5 = sljit_emit_cmp(compiler,0,1,0,0x8e,(long)common->ovector_start + 8);
      if (compiler->error == 0) {
        pjVar6 = (jump_list *)ensure_abuf(compiler,0x10);
      }
      if (pjVar6 != (jump_list *)0x0) {
        pjVar6->next = *backtracks;
        pjVar6->jump = psVar5;
        *backtracks = pjVar6;
      }
    }
  }
  else if (compiler->error == 0) {
    compiler->mode32 = 0;
    uVar10 = 0;
    psVar4 = emit_x86_instruction(compiler,1,1,0,0x84,0);
    if (psVar4 != (sljit_u8 *)0x0) {
      *psVar4 = 0x8b;
    }
  }
  else {
    uVar10 = 0;
  }
  if ((ushort)(PVar1 - 0x71) < 2) {
    if (compiler->error != 0) goto LAB_00110ed6;
    src1w = (long)common->ovector_start + (ulong)uVar10 * 8 + 8;
    compiler->mode32 = 0;
    src1 = 0x8e;
  }
  else {
    if (compiler->error != 0) goto LAB_00110ed6;
    compiler->mode32 = 0;
    src1w = 8;
    src1 = 0x84;
  }
  emit_non_cum_binary(compiler,0x2d2b2928,4,0,src1,src1w,1,0);
LAB_00110ed6:
  if (withchecks == 0) {
    local_58 = (sljit_jump *)0x0;
  }
  else {
    local_58 = sljit_emit_jump(compiler,0);
  }
  sljit_emit_op2(compiler,0x60,2,0,2,0,4,0);
  psVar5 = sljit_emit_cmp(compiler,4,2,0,0xd,0);
  if (common->mode == 1) {
    if (compiler->error == 0) {
      pjVar6 = (jump_list *)ensure_abuf(compiler,0x10);
    }
    else {
      pjVar6 = (jump_list *)0x0;
    }
    if (pjVar6 != (jump_list *)0x0) {
      pjVar6->next = *backtracks;
      pjVar6->jump = psVar5;
      *backtracks = pjVar6;
    }
  }
  ppjVar11 = &common->caselesscmp;
  if (*cc == 0x71) {
    ppjVar11 = &common->casefulcmp;
  }
  psVar7 = sljit_emit_jump(compiler,0x19);
  if (compiler->error == 0) {
    pjVar6 = (jump_list *)ensure_abuf(compiler,0x10);
  }
  else {
    pjVar6 = (jump_list *)0x0;
  }
  if (pjVar6 != (jump_list *)0x0) {
    pjVar6->next = *ppjVar11;
    pjVar6->jump = psVar7;
    *ppjVar11 = pjVar6;
  }
  pjVar6 = (jump_list *)0x0;
  psVar7 = sljit_emit_cmp(compiler,1,4,0,0x40,0);
  if (compiler->error == 0) {
    pjVar6 = (jump_list *)ensure_abuf(compiler,0x10);
  }
  if (pjVar6 != (jump_list *)0x0) {
    pjVar6->next = *backtracks;
    pjVar6->jump = psVar7;
    *backtracks = pjVar6;
  }
  if (common->mode != 1) {
    psVar7 = sljit_emit_jump(compiler,0x18);
    psVar9 = sljit_emit_label(compiler);
    if ((psVar5 != (sljit_jump *)0x0) && (psVar9 != (sljit_label *)0x0)) {
      psVar5->flags = (psVar5->flags & 0xfffffffffffffffcU) + 1;
      (psVar5->u).label = psVar9;
    }
    if (compiler->error == 0) {
      compiler->mode32 = 0;
      psVar4 = emit_x86_instruction(compiler,1,4,0,2,0);
      if (psVar4 != (sljit_u8 *)0x0) {
        *psVar4 = '+';
      }
    }
    sljit_emit_op2(compiler,0x60,4,0,4,0,0xd,0);
    psVar5 = sljit_emit_cmp(compiler,0,4,0,0x40,0);
    if (compiler->error == 0) {
      compiler->mode32 = 0;
      psVar4 = emit_x86_instruction(compiler,1,0xd,0,2,0);
      if (psVar4 != (sljit_u8 *)0x0) {
        *psVar4 = 0x89;
      }
    }
    ppjVar11 = &common->caselesscmp;
    if (*cc == 0x71) {
      ppjVar11 = &common->casefulcmp;
    }
    psVar8 = sljit_emit_jump(compiler,0x19);
    if (compiler->error == 0) {
      pjVar6 = (jump_list *)ensure_abuf(compiler,0x10);
    }
    else {
      pjVar6 = (jump_list *)0x0;
    }
    if (pjVar6 != (jump_list *)0x0) {
      pjVar6->next = *ppjVar11;
      pjVar6->jump = psVar8;
      *ppjVar11 = pjVar6;
    }
    pjVar6 = (jump_list *)0x0;
    psVar8 = sljit_emit_cmp(compiler,1,4,0,0x40,0);
    if (compiler->error == 0) {
      pjVar6 = (jump_list *)ensure_abuf(compiler,0x10);
    }
    if (pjVar6 != (jump_list *)0x0) {
      pjVar6->next = *backtracks;
      pjVar6->jump = psVar8;
      *backtracks = pjVar6;
    }
    psVar9 = sljit_emit_label(compiler);
    if ((psVar5 != (sljit_jump *)0x0) && (psVar9 != (sljit_label *)0x0)) {
      psVar5->flags = (psVar5->flags & 0xfffffffffffffffcU) + 1;
      (psVar5->u).label = psVar9;
    }
    pjVar6 = (jump_list *)0x0;
    check_partial(common,0);
    psVar5 = sljit_emit_jump(compiler,0x18);
    if (compiler->error == 0) {
      pjVar6 = (jump_list *)ensure_abuf(compiler,0x10);
    }
    if (pjVar6 != (jump_list *)0x0) {
      pjVar6->next = *backtracks;
      pjVar6->jump = psVar5;
      *backtracks = pjVar6;
    }
    psVar9 = sljit_emit_label(compiler);
    if ((psVar7 != (sljit_jump *)0x0) && (psVar9 != (sljit_label *)0x0)) {
      psVar7->flags = (psVar7->flags & 0xfffffffffffffffcU) + 1;
      (psVar7->u).label = psVar9;
    }
  }
  if (local_58 != (sljit_jump *)0x0) {
    if (emptyfail == 0) {
      psVar9 = sljit_emit_label(compiler);
      if (psVar9 != (sljit_label *)0x0) {
        local_58->flags = (local_58->flags & 0xfffffffffffffffcU) + 1;
        (local_58->u).label = psVar9;
      }
    }
    else {
      if (compiler->error == 0) {
        pjVar6 = (jump_list *)ensure_abuf(compiler,0x10);
      }
      else {
        pjVar6 = (jump_list *)0x0;
      }
      if (pjVar6 != (jump_list *)0x0) {
        pjVar6->next = *backtracks;
        pjVar6->jump = local_58;
        *backtracks = pjVar6;
      }
    }
  }
  return;
}

Assistant:

static void compile_ref_matchingpath(compiler_common *common, PCRE2_SPTR cc, jump_list **backtracks, BOOL withchecks, BOOL emptyfail)
{
DEFINE_COMPILER;
BOOL ref = (*cc == OP_REF || *cc == OP_REFI);
int offset = 0;
struct sljit_jump *jump = NULL;
struct sljit_jump *partial;
struct sljit_jump *nopartial;

if (ref)
  {
  offset = GET2(cc, 1) << 1;
  OP1(SLJIT_MOV, TMP1, 0, SLJIT_MEM1(SLJIT_SP), OVECTOR(offset));
  /* OVECTOR(1) contains the "string begin - 1" constant. */
  if (withchecks && !common->unset_backref)
    add_jump(compiler, backtracks, CMP(SLJIT_EQUAL, TMP1, 0, SLJIT_MEM1(SLJIT_SP), OVECTOR(1)));
  }
else
  OP1(SLJIT_MOV, TMP1, 0, SLJIT_MEM1(TMP2), 0);

#if defined SUPPORT_UNICODE
if (common->utf && *cc == OP_REFI)
  {
  SLJIT_ASSERT(TMP1 == SLJIT_R0 && STR_PTR == SLJIT_R1);
  if (ref)
    OP1(SLJIT_MOV, SLJIT_R2, 0, SLJIT_MEM1(SLJIT_SP), OVECTOR(offset + 1));
  else
    OP1(SLJIT_MOV, SLJIT_R2, 0, SLJIT_MEM1(TMP2), sizeof(sljit_sw));

  if (withchecks)
    jump = CMP(SLJIT_EQUAL, TMP1, 0, SLJIT_R2, 0);
  /* No free saved registers so save data on stack. */

  OP1(SLJIT_MOV, SLJIT_R3, 0, STR_END, 0);
  sljit_emit_icall(compiler, SLJIT_CALL, SLJIT_RET(SW) | SLJIT_ARG1(SW) | SLJIT_ARG2(SW) | SLJIT_ARG3(SW) | SLJIT_ARG4(SW), SLJIT_IMM, SLJIT_FUNC_OFFSET(do_utf_caselesscmp));
  OP1(SLJIT_MOV, STR_PTR, 0, SLJIT_RETURN_REG, 0);

  if (common->mode == PCRE2_JIT_COMPLETE)
    add_jump(compiler, backtracks, CMP(SLJIT_LESS_EQUAL, SLJIT_RETURN_REG, 0, SLJIT_IMM, 1));
  else
    {
    OP2(SLJIT_SUB | SLJIT_SET_Z | SLJIT_SET_LESS, SLJIT_UNUSED, 0, SLJIT_RETURN_REG, 0, SLJIT_IMM, 1);

    add_jump(compiler, backtracks, JUMP(SLJIT_LESS));

    nopartial = JUMP(SLJIT_NOT_EQUAL);
    OP1(SLJIT_MOV, STR_PTR, 0, STR_END, 0);
    check_partial(common, FALSE);
    add_jump(compiler, backtracks, JUMP(SLJIT_JUMP));
    JUMPHERE(nopartial);
    }
  }
else
#endif /* SUPPORT_UNICODE */
  {
  if (ref)
    OP2(SLJIT_SUB | SLJIT_SET_Z, TMP2, 0, SLJIT_MEM1(SLJIT_SP), OVECTOR(offset + 1), TMP1, 0);
  else
    OP2(SLJIT_SUB | SLJIT_SET_Z, TMP2, 0, SLJIT_MEM1(TMP2), sizeof(sljit_sw), TMP1, 0);

  if (withchecks)
    jump = JUMP(SLJIT_ZERO);

  OP2(SLJIT_ADD, STR_PTR, 0, STR_PTR, 0, TMP2, 0);
  partial = CMP(SLJIT_GREATER, STR_PTR, 0, STR_END, 0);
  if (common->mode == PCRE2_JIT_COMPLETE)
    add_jump(compiler, backtracks, partial);

  add_jump(compiler, *cc == OP_REF ? &common->casefulcmp : &common->caselesscmp, JUMP(SLJIT_FAST_CALL));
  add_jump(compiler, backtracks, CMP(SLJIT_NOT_EQUAL, TMP2, 0, SLJIT_IMM, 0));

  if (common->mode != PCRE2_JIT_COMPLETE)
    {
    nopartial = JUMP(SLJIT_JUMP);
    JUMPHERE(partial);
    /* TMP2 -= STR_END - STR_PTR */
    OP2(SLJIT_SUB, TMP2, 0, TMP2, 0, STR_PTR, 0);
    OP2(SLJIT_ADD, TMP2, 0, TMP2, 0, STR_END, 0);
    partial = CMP(SLJIT_EQUAL, TMP2, 0, SLJIT_IMM, 0);
    OP1(SLJIT_MOV, STR_PTR, 0, STR_END, 0);
    add_jump(compiler, *cc == OP_REF ? &common->casefulcmp : &common->caselesscmp, JUMP(SLJIT_FAST_CALL));
    add_jump(compiler, backtracks, CMP(SLJIT_NOT_EQUAL, TMP2, 0, SLJIT_IMM, 0));
    JUMPHERE(partial);
    check_partial(common, FALSE);
    add_jump(compiler, backtracks, JUMP(SLJIT_JUMP));
    JUMPHERE(nopartial);
    }
  }

if (jump != NULL)
  {
  if (emptyfail)
    add_jump(compiler, backtracks, jump);
  else
    JUMPHERE(jump);
  }
}